

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_parse_url_options(connectdata *conn)

{
  char *first;
  int iVar1;
  char *value_00;
  bool bVar2;
  char *value;
  char *key;
  char *ptr;
  smtp_conn *smtpc;
  CURLcode result;
  connectdata *conn_local;
  
  smtpc._4_4_ = CURLE_OK;
  key = conn->options;
  *(undefined1 *)((long)&conn->proto + 0x98) = 1;
  while( true ) {
    first = key;
    bVar2 = false;
    if ((smtpc._4_4_ == CURLE_OK) && (bVar2 = false, key != (char *)0x0)) {
      bVar2 = *key != '\0';
    }
    if (!bVar2) break;
    while( true ) {
      bVar2 = false;
      if (*key != '\0') {
        bVar2 = *key != '=';
      }
      if (!bVar2) break;
      key = key + 1;
    }
    value_00 = key + 1;
    while( true ) {
      bVar2 = false;
      if (*key != '\0') {
        bVar2 = *key != ';';
      }
      if (!bVar2) break;
      key = key + 1;
    }
    iVar1 = curl_strnequal(first,"AUTH=",5);
    if (iVar1 == 0) {
      smtpc._4_4_ = CURLE_URL_MALFORMAT;
    }
    else {
      smtpc._4_4_ = Curl_sasl_parse_url_auth_option
                              ((SASL *)&(conn->proto).imapc.sasl.state,value_00,
                               (long)key - (long)value_00);
    }
    if (*key == ';') {
      key = key + 1;
    }
  }
  return smtpc._4_4_;
}

Assistant:

static CURLcode smtp_parse_url_options(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  const char *ptr = conn->options;

  smtpc->sasl.resetprefs = TRUE;

  while(!result && ptr && *ptr) {
    const char *key = ptr;
    const char *value;

    while(*ptr && *ptr != '=')
        ptr++;

    value = ptr + 1;

    while(*ptr && *ptr != ';')
      ptr++;

    if(strnequal(key, "AUTH=", 5))
      result = Curl_sasl_parse_url_auth_option(&smtpc->sasl,
                                               value, ptr - value);
    else
      result = CURLE_URL_MALFORMAT;

    if(*ptr == ';')
      ptr++;
  }

  return result;
}